

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O0

void __thiscall DemoM6502::DrawCode(DemoM6502 *this,int x,int y,int nLines)

{
  int iVar1;
  bool bVar2;
  _Self *p_Var3;
  reference ppVar4;
  _Self local_68;
  _Self local_60;
  _Base_ptr local_58;
  anon_union_4_2_12391da5_for_Pixel_0 local_4c;
  _Self local_48;
  anon_union_4_2_12391da5_for_Pixel_0 local_3c;
  _Self local_38;
  int local_2c;
  iterator iStack_28;
  int nLineY;
  iterator it_a;
  int nLines_local;
  int y_local;
  int x_local;
  DemoM6502 *this_local;
  
  it_a._M_node._4_4_ = nLines;
  iStack_28 = std::
              map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this->mapAsm,&(this->nes).cpu.pc);
  local_2c = (it_a._M_node._4_4_ >> 1) * 10 + y;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->mapAsm);
  bVar2 = std::operator!=(&stack0xffffffffffffffd8,&local_38);
  iVar1 = local_2c;
  if (bVar2) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&stack0xffffffffffffffd8);
    local_3c.n = olc::CYAN.n;
    olc::PixelGameEngine::DrawString
              (&this->super_PixelGameEngine,x,iVar1,&ppVar4->second,(Pixel)olc::CYAN.field_1,1);
    while (local_2c < it_a._M_node._4_4_ * 10 + y) {
      local_2c = local_2c + 10;
      p_Var3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator++(&stack0xffffffffffffffd8);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->mapAsm);
      bVar2 = std::operator!=(p_Var3,&local_48);
      iVar1 = local_2c;
      if (bVar2) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&stack0xffffffffffffffd8);
        local_4c.n = olc::WHITE.n;
        olc::PixelGameEngine::DrawString
                  (&this->super_PixelGameEngine,x,iVar1,&ppVar4->second,(Pixel)olc::WHITE.field_1,1)
        ;
      }
    }
  }
  local_58 = (_Base_ptr)
             std::
             map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&this->mapAsm,&(this->nes).cpu.pc);
  local_2c = (it_a._M_node._4_4_ >> 1) * 10 + y;
  iStack_28 = (iterator)local_58;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->mapAsm);
  bVar2 = std::operator!=(&stack0xffffffffffffffd8,&local_60);
  if (bVar2) {
    while (y < local_2c) {
      local_2c = local_2c + -10;
      p_Var3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator--(&stack0xffffffffffffffd8);
      local_68._M_node =
           (_Base_ptr)
           std::
           map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->mapAsm);
      bVar2 = std::operator!=(p_Var3,&local_68);
      iVar1 = local_2c;
      if (bVar2) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&stack0xffffffffffffffd8);
        olc::PixelGameEngine::DrawString
                  (&this->super_PixelGameEngine,x,iVar1,&ppVar4->second,(Pixel)olc::WHITE.field_1,1)
        ;
      }
    }
  }
  return;
}

Assistant:

void DrawCode(int x, int y, int nLines)
  {
    auto it_a = mapAsm.find(nes.cpu.pc);
    int nLineY = (nLines >> 1) * 10 + y;
    if (it_a != mapAsm.end())
    {
      DrawString(x, nLineY, (*it_a).second, olc::CYAN);
      while (nLineY < (nLines * 10) + y)
      {
        nLineY += 10;
        if (++it_a != mapAsm.end())
        {
          DrawString(x, nLineY, (*it_a).second);
        }
      }
    }

    it_a = mapAsm.find(nes.cpu.pc);
    nLineY = (nLines >> 1) * 10 + y;
    if (it_a != mapAsm.end())
    {
      while (nLineY > y)
      {
        nLineY -= 10;
        if (--it_a != mapAsm.end())
        {
          DrawString(x, nLineY, (*it_a).second);
        }
      }
    }
  }